

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeShader
                 (qpTestLog *log,qpShaderType type,char *source,deBool compileOk,char *infoLog)

{
  uint uVar1;
  char *elementName;
  deBool dVar2;
  char *elementContent;
  deBool dVar3;
  qpXmlAttribute shaderAttribs [4];
  
  elementName = s_qpShaderTypeMap[(int)type].string;
  uVar1 = log->flags;
  deMutex_lock(log->lock);
  shaderAttribs[0].stringValue = "Fail";
  if (compileOk != 0) {
    shaderAttribs[0].stringValue = "OK";
  }
  shaderAttribs[0].name = "CompileStatus";
  shaderAttribs[0].type = QP_XML_ATTRIBUTE_STRING;
  shaderAttribs[0].intValue = -0x2a6;
  shaderAttribs[0].boolValue = -1;
  dVar3 = 1;
  dVar2 = qpXmlWriter_startElement(log->writer,elementName,1,shaderAttribs);
  if (dVar2 != 0) {
    elementContent = "";
    if ((uVar1 & 2) == 0) {
      elementContent = source;
    }
    if (compileOk == 0) {
      elementContent = source;
    }
    dVar2 = qpXmlWriter_writeStringElement(log->writer,"ShaderSource",elementContent);
    if (dVar2 != 0) {
      dVar2 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",infoLog);
      if (dVar2 != 0) {
        dVar2 = qpXmlWriter_endElement(log->writer,elementName);
        if (dVar2 != 0) goto LAB_00598761;
      }
    }
  }
  dVar3 = 0;
  qpPrintf("qpTestLog_writeShader(): Writing XML failed\n");
LAB_00598761:
  deMutex_unlock(log->lock);
  return dVar3;
}

Assistant:

deBool qpTestLog_writeShader (qpTestLog* log, qpShaderType type, const char* source, deBool compileOk, const char* infoLog)
{
	const char*		tagName				= QP_LOOKUP_STRING(s_qpShaderTypeMap, type);
	const char*		sourceStr			= ((log->flags & QP_TEST_LOG_EXCLUDE_SHADER_SOURCES) == 0 || !compileOk) ? source : "";
	int				numShaderAttribs	= 0;
	qpXmlAttribute	shaderAttribs[4];

	deMutex_lock(log->lock);

	DE_ASSERT(source);
	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SHADERPROGRAM);

	shaderAttribs[numShaderAttribs++]	= qpSetStringAttrib("CompileStatus", compileOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, tagName, numShaderAttribs, shaderAttribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "ShaderSource", sourceStr) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", infoLog) ||
		!qpXmlWriter_endElement(log->writer, tagName))
	{
		qpPrintf("qpTestLog_writeShader(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}